

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O1

void helper_sve_trn_p_aarch64(void *vd,void *vn,void *vm,uint32_t pred_desc)

{
  ulong uVar1;
  byte bVar2;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar3;
  
  uVar4 = pred_desc >> 10 & 3;
  uVar3 = 1 << (sbyte)uVar4;
  bVar2 = (byte)uVar3;
  uVar5 = 0;
  uVar1 = uVar5;
  if ((pred_desc >> 0xc & 1) != 0) {
    bVar2 = 0;
    uVar1 = (ulong)uVar3;
  }
  uVar6 = even_bit_esz_masks[uVar4] << ((byte)uVar1 & 0x3f);
  do {
    *(ulong *)((long)vd + uVar5 * 8) =
         ((*(ulong *)((long)vm + uVar5 * 8) & uVar6) << (bVar2 & 0x3f)) +
         ((*(ulong *)((long)vn + uVar5 * 8) & uVar6) >> ((byte)uVar1 & 0x3f));
    uVar5 = uVar5 + 1;
  } while ((pred_desc & 0x1f) + 9 >> 3 != uVar5);
  return;
}

Assistant:

void HELPER(sve_trn_p)(void *vd, void *vn, void *vm, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    uintptr_t esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    bool odd = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd, *n = vn, *m = vm;
    uint64_t mask;
    int shr, shl;
    intptr_t i;

    shl = 1 << esz;
    shr = 0;
    mask = even_bit_esz_masks[esz];
    if (odd) {
        mask <<= shl;
        shr = shl;
        shl = 0;
    }

    for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
        uint64_t nn = (n[i] & mask) >> shr;
        uint64_t mm = (m[i] & mask) << shl;
        d[i] = nn + mm;
    }
}